

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

int Dau_DsdBalance(Gia_Man_t *pGia,int *pFans,int nFans,int fAnd)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar6;
  int local_3c;
  int fCompl;
  int iFan;
  int iFan1;
  int iFan0;
  Gia_Obj_t *pObj;
  int fAnd_local;
  int nFans_local;
  int *pFans_local;
  Gia_Man_t *pGia_local;
  
  if (nFans == 1) {
    pGia_local._4_4_ = *pFans;
  }
  else {
    if (nFans < 2) {
      __assert_fail("nFans > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                    ,0xee,"int Dau_DsdBalance(Gia_Man_t *, int *, int, int)");
    }
    iVar5 = pFans[nFans + -1];
    iVar4 = pFans[nFans + -2];
    iVar1 = Vec_IntSize(&pGia->vHTable);
    if (iVar1 == 0) {
      if (fAnd == 0) {
        if (pGia->pMuxes == (uint *)0x0) {
          local_3c = Gia_ManAppendXor2(pGia,iVar5,iVar4);
        }
        else {
          uVar2 = Abc_LitIsCompl(iVar5);
          uVar3 = Abc_LitIsCompl(iVar4);
          iVar5 = Abc_LitRegular(iVar5);
          iVar4 = Abc_LitRegular(iVar4);
          iVar5 = Gia_ManAppendXorReal(pGia,iVar5,iVar4);
          local_3c = Abc_LitNotCond(iVar5,uVar2 ^ uVar3);
        }
      }
      else {
        local_3c = Gia_ManAppendAnd2(pGia,iVar5,iVar4);
      }
    }
    else if (fAnd == 0) {
      if (pGia->pMuxes == (uint *)0x0) {
        local_3c = Gia_ManHashXor(pGia,iVar5,iVar4);
      }
      else {
        local_3c = Gia_ManHashXorReal(pGia,iVar5,iVar4);
      }
    }
    else {
      local_3c = Gia_ManHashAnd(pGia,iVar5,iVar4);
    }
    iVar5 = Abc_Lit2Var(local_3c);
    pObj_00 = Gia_ManObj(pGia,iVar5);
    iVar5 = Gia_ObjIsAnd(pObj_00);
    if (iVar5 != 0) {
      if (fAnd == 0) {
        if (pGia->pMuxes == (uint *)0x0) {
          pGVar6 = Gia_ObjFanin0(pObj_00);
          iVar5 = Gia_ObjIsAnd(pGVar6);
          if (iVar5 != 0) {
            pGVar6 = Gia_ObjFanin0(pObj_00);
            Gia_ObjSetAndLevel(pGia,pGVar6);
          }
          pGVar6 = Gia_ObjFanin1(pObj_00);
          iVar5 = Gia_ObjIsAnd(pGVar6);
          if (iVar5 != 0) {
            pGVar6 = Gia_ObjFanin1(pObj_00);
            Gia_ObjSetAndLevel(pGia,pGVar6);
          }
          Gia_ObjSetAndLevel(pGia,pObj_00);
        }
        else {
          Gia_ObjSetXorLevel(pGia,pObj_00);
        }
      }
      else {
        Gia_ObjSetAndLevel(pGia,pObj_00);
      }
    }
    Dau_DsdAddToArray(pGia,pFans,nFans + -2,local_3c);
    pGia_local._4_4_ = Dau_DsdBalance(pGia,pFans,nFans + -1,fAnd);
  }
  return pGia_local._4_4_;
}

Assistant:

int Dau_DsdBalance( Gia_Man_t * pGia, int * pFans, int nFans, int fAnd )
{
    Gia_Obj_t * pObj;
    int iFan0, iFan1, iFan;
    if ( nFans == 1 )
        return pFans[0];
    assert( nFans > 1 );
    iFan0 = pFans[--nFans];
    iFan1 = pFans[--nFans];
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
    {
        if ( fAnd )
            iFan = Gia_ManAppendAnd2( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
        {
            int fCompl = Abc_LitIsCompl(iFan0) ^ Abc_LitIsCompl(iFan1);
            iFan = Gia_ManAppendXorReal( pGia, Abc_LitRegular(iFan0), Abc_LitRegular(iFan1) );
            iFan = Abc_LitNotCond( iFan, fCompl );
        }
        else 
            iFan = Gia_ManAppendXor2( pGia, iFan0, iFan1 );
    }
    else
    {
        if ( fAnd )
            iFan = Gia_ManHashAnd( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
            iFan = Gia_ManHashXorReal( pGia, iFan0, iFan1 );
        else 
            iFan = Gia_ManHashXor( pGia, iFan0, iFan1 );
    }
    pObj = Gia_ManObj(pGia, Abc_Lit2Var(iFan));
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( fAnd )
            Gia_ObjSetAndLevel( pGia, pObj );
        else if ( pGia->pMuxes )
            Gia_ObjSetXorLevel( pGia, pObj );
        else 
        {
            if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
            if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
            Gia_ObjSetAndLevel( pGia, pObj );
        }
    }
    Dau_DsdAddToArray( pGia, pFans, nFans++, iFan );
    return Dau_DsdBalance( pGia, pFans, nFans, fAnd );
}